

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int16_t iVar2;
  int *piVar3;
  int *piVar4;
  short sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  parasail_result_t *ppVar11;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar12;
  ulong uVar13;
  short sVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  short sVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  undefined4 uVar30;
  uint uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined2 uVar41;
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  short sVar45;
  short sVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined2 uVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  uint local_310;
  uint local_308;
  uint local_300;
  uint local_2f8;
  uint local_2f0;
  uint local_2e8;
  uint local_2e0;
  uint local_2d8;
  uint local_2d0;
  uint local_2c8;
  int16_t *local_2c0;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  undefined1 local_1e8 [32];
  undefined1 local_158 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_avx2_256_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_avx2_256_16_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_avx2_256_16_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_avx2_256_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_avx2_256_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_avx2_256_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar21 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_table_diag_avx2_256_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar21 = (ulong)(uint)matrix->length;
    }
    auVar56 = vpinsrd_avx(ZEXT416((uint)gap),open,1);
    auVar52 = vpmovsxbd_avx2(ZEXT816(0x100000000000000));
    auVar52 = vpermd_avx2(auVar52,ZEXT1632(auVar56));
    auVar52 = vpmulld_avx2(auVar52,_DAT_009091c0);
    iVar23 = auVar52._28_4_;
    iVar25 = -matrix->min;
    if (iVar23 < matrix->min) {
      iVar25 = open;
    }
    sVar18 = 0x7ffe - (short)matrix->max;
    uVar20 = (uint)uVar21;
    auVar51 = ZEXT1632(in_ZMM6._0_16_);
    ppVar11 = parasail_result_new_table1(uVar20,s2Len);
    if (ppVar11 != (parasail_result_t *)0x0) {
      ppVar11->flag = ppVar11->flag | 0x10221001;
      uVar16 = (ulong)(s2Len + 0x1e);
      ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar16);
      ptr_00 = parasail_memalign_int16_t(0x20,uVar16);
      ptr_01 = parasail_memalign_int16_t(0x20,uVar16);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        if (matrix->type == 0) {
          iVar15 = uVar20 + 0xf;
          local_2c0 = parasail_memalign_int16_t(0x20,(long)iVar15);
          if (local_2c0 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar20) {
            piVar3 = matrix->mapper;
            uVar16 = 0;
            do {
              local_2c0[uVar16] = (int16_t)piVar3[(byte)_s1[uVar16]];
              uVar16 = uVar16 + 1;
            } while (uVar21 != uVar16);
          }
          iVar10 = uVar20 + 1;
          if ((int)(uVar20 + 1) < iVar15) {
            iVar10 = iVar15;
          }
          memset(local_2c0 + (int)uVar20,0,(ulong)(~uVar20 + iVar10) * 2 + 2);
        }
        else {
          local_2c0 = (int16_t *)0x0;
        }
        uVar24 = gap * 0xfffb - open;
        sVar14 = (short)gap;
        sVar5 = (short)open;
        sVar46 = sVar14 * -6 - sVar5;
        auVar56 = vpinsrd_avx(ZEXT416((uint)open),gap * 8,1);
        sVar45 = sVar14 * -7 - sVar5;
        uVar29 = s2Len + 0xf;
        auVar47._0_2_ = (undefined2)uVar21;
        auVar47._2_2_ = auVar47._0_2_;
        auVar47._4_2_ = auVar47._0_2_;
        auVar47._6_2_ = auVar47._0_2_;
        auVar47._8_2_ = auVar47._0_2_;
        auVar47._10_2_ = auVar47._0_2_;
        auVar47._12_2_ = auVar47._0_2_;
        auVar47._14_2_ = auVar47._0_2_;
        auVar47._16_2_ = auVar47._0_2_;
        auVar47._18_2_ = auVar47._0_2_;
        auVar47._20_2_ = auVar47._0_2_;
        auVar47._22_2_ = auVar47._0_2_;
        auVar47._24_2_ = auVar47._0_2_;
        auVar47._26_2_ = auVar47._0_2_;
        auVar47._28_2_ = auVar47._0_2_;
        auVar47._30_2_ = auVar47._0_2_;
        auVar43 = vpcmpeqd_avx2(auVar51,auVar51);
        auVar51 = vpaddsw_avx2(auVar47,auVar43);
        auVar48._0_2_ = (undefined2)s2Len;
        auVar48._2_2_ = auVar48._0_2_;
        auVar48._4_2_ = auVar48._0_2_;
        auVar48._6_2_ = auVar48._0_2_;
        auVar48._8_2_ = auVar48._0_2_;
        auVar48._10_2_ = auVar48._0_2_;
        auVar48._12_2_ = auVar48._0_2_;
        auVar48._14_2_ = auVar48._0_2_;
        auVar48._16_2_ = auVar48._0_2_;
        auVar48._18_2_ = auVar48._0_2_;
        auVar48._20_2_ = auVar48._0_2_;
        auVar48._22_2_ = auVar48._0_2_;
        auVar48._24_2_ = auVar48._0_2_;
        auVar48._26_2_ = auVar48._0_2_;
        auVar48._28_2_ = auVar48._0_2_;
        auVar48._30_2_ = auVar48._0_2_;
        auVar43 = vpaddsw_avx2(auVar48,auVar43);
        local_308 = uVar20 - 1;
        auVar32 = vpmovsxbd_avx2(ZEXT816(0x100000000000000));
        auVar32 = vpermd_avx2(auVar32,ZEXT1632(auVar56));
        iVar15 = s2Len + -1;
        iVar25 = iVar25 + -0x7fff;
        auVar47 = vpsubd_avx2(auVar52,auVar32);
        local_1e8._2_2_ = (undefined2)iVar25;
        local_1e8._0_2_ = local_1e8._2_2_;
        local_1e8._4_2_ = local_1e8._2_2_;
        local_1e8._6_2_ = local_1e8._2_2_;
        local_1e8._8_2_ = local_1e8._2_2_;
        local_1e8._10_2_ = local_1e8._2_2_;
        local_1e8._12_2_ = local_1e8._2_2_;
        local_1e8._14_2_ = local_1e8._2_2_;
        local_1e8._16_2_ = local_1e8._2_2_;
        local_1e8._18_2_ = local_1e8._2_2_;
        local_1e8._20_2_ = local_1e8._2_2_;
        local_1e8._22_2_ = local_1e8._2_2_;
        local_1e8._24_2_ = local_1e8._2_2_;
        local_1e8._26_2_ = local_1e8._2_2_;
        local_1e8._28_2_ = local_1e8._2_2_;
        local_1e8._30_2_ = local_1e8._2_2_;
        auVar32._2_2_ = sVar45;
        auVar32._0_2_ = sVar45;
        auVar32._4_2_ = sVar45;
        auVar32._6_2_ = sVar45;
        auVar32._8_2_ = sVar45;
        auVar32._10_2_ = sVar45;
        auVar32._12_2_ = sVar45;
        auVar32._14_2_ = sVar45;
        auVar32._16_2_ = sVar45;
        auVar32._18_2_ = sVar45;
        auVar32._20_2_ = sVar45;
        auVar32._22_2_ = sVar45;
        auVar32._24_2_ = sVar45;
        auVar32._26_2_ = sVar45;
        auVar32._28_2_ = sVar45;
        auVar32._30_2_ = sVar45;
        auVar33._2_2_ = sVar46;
        auVar33._0_2_ = sVar46;
        auVar33._4_2_ = sVar46;
        auVar33._6_2_ = sVar46;
        auVar33._8_2_ = sVar46;
        auVar33._10_2_ = sVar46;
        auVar33._12_2_ = sVar46;
        auVar33._14_2_ = sVar46;
        auVar33._16_2_ = sVar46;
        auVar33._18_2_ = sVar46;
        auVar33._20_2_ = sVar46;
        auVar33._22_2_ = sVar46;
        auVar33._24_2_ = sVar46;
        auVar33._26_2_ = sVar46;
        auVar33._28_2_ = sVar46;
        auVar33._30_2_ = sVar46;
        auVar32 = vpblendw_avx2(auVar32,auVar33,2);
        uVar41 = (undefined2)(gap << 4);
        uVar50 = (undefined2)uVar24;
        auVar34._2_2_ = uVar50;
        auVar34._0_2_ = uVar50;
        auVar34._4_2_ = uVar50;
        auVar34._6_2_ = uVar50;
        auVar34._8_2_ = uVar50;
        auVar34._10_2_ = uVar50;
        auVar34._12_2_ = uVar50;
        auVar34._14_2_ = uVar50;
        auVar34._16_2_ = uVar50;
        auVar34._18_2_ = uVar50;
        auVar34._20_2_ = uVar50;
        auVar34._22_2_ = uVar50;
        auVar34._24_2_ = uVar50;
        auVar34._26_2_ = uVar50;
        auVar34._28_2_ = uVar50;
        auVar34._30_2_ = uVar50;
        auVar32 = vpblendw_avx2(auVar32,auVar34,4);
        auVar47 = vpshufb_avx2(auVar47,_DAT_009091e0);
        auVar47 = vpermq_avx2(auVar47,0xe8);
        auVar35._0_2_ = (undefined2)(iVar23 + gap * -4);
        auVar35._2_2_ = auVar35._0_2_;
        auVar35._4_2_ = auVar35._0_2_;
        auVar35._6_2_ = auVar35._0_2_;
        auVar35._8_2_ = auVar35._0_2_;
        auVar35._10_2_ = auVar35._0_2_;
        auVar35._12_2_ = auVar35._0_2_;
        auVar35._14_2_ = auVar35._0_2_;
        auVar35._16_2_ = auVar35._0_2_;
        auVar35._18_2_ = auVar35._0_2_;
        auVar35._20_2_ = auVar35._0_2_;
        auVar35._22_2_ = auVar35._0_2_;
        auVar35._24_2_ = auVar35._0_2_;
        auVar35._26_2_ = auVar35._0_2_;
        auVar35._28_2_ = auVar35._0_2_;
        auVar35._30_2_ = auVar35._0_2_;
        auVar32 = vpblendw_avx2(auVar32,auVar35,8);
        auVar36._0_2_ = (undefined2)(gap * 0xfffd - open);
        auVar36._2_2_ = auVar36._0_2_;
        auVar36._4_2_ = auVar36._0_2_;
        auVar36._6_2_ = auVar36._0_2_;
        auVar36._8_2_ = auVar36._0_2_;
        auVar36._10_2_ = auVar36._0_2_;
        auVar36._12_2_ = auVar36._0_2_;
        auVar36._14_2_ = auVar36._0_2_;
        auVar36._16_2_ = auVar36._0_2_;
        auVar36._18_2_ = auVar36._0_2_;
        auVar36._20_2_ = auVar36._0_2_;
        auVar36._22_2_ = auVar36._0_2_;
        auVar36._24_2_ = auVar36._0_2_;
        auVar36._26_2_ = auVar36._0_2_;
        auVar36._28_2_ = auVar36._0_2_;
        auVar36._30_2_ = auVar36._0_2_;
        auVar32 = vpblendw_avx2(auVar32,auVar36,0x10);
        auVar37._0_2_ = (undefined2)(iVar23 + gap * -2);
        auVar37._2_2_ = auVar37._0_2_;
        auVar37._4_2_ = auVar37._0_2_;
        auVar37._6_2_ = auVar37._0_2_;
        auVar37._8_2_ = auVar37._0_2_;
        auVar37._10_2_ = auVar37._0_2_;
        auVar37._12_2_ = auVar37._0_2_;
        auVar37._14_2_ = auVar37._0_2_;
        auVar37._16_2_ = auVar37._0_2_;
        auVar37._18_2_ = auVar37._0_2_;
        auVar37._20_2_ = auVar37._0_2_;
        auVar37._22_2_ = auVar37._0_2_;
        auVar37._24_2_ = auVar37._0_2_;
        auVar37._26_2_ = auVar37._0_2_;
        auVar37._28_2_ = auVar37._0_2_;
        auVar37._30_2_ = auVar37._0_2_;
        auVar32 = vpblendw_avx2(auVar32,auVar37,0x20);
        auVar38._0_2_ = (undefined2)(iVar23 - gap);
        auVar38._2_2_ = auVar38._0_2_;
        auVar38._4_2_ = auVar38._0_2_;
        auVar38._6_2_ = auVar38._0_2_;
        auVar38._8_2_ = auVar38._0_2_;
        auVar38._10_2_ = auVar38._0_2_;
        auVar38._12_2_ = auVar38._0_2_;
        auVar38._14_2_ = auVar38._0_2_;
        auVar38._16_2_ = auVar38._0_2_;
        auVar38._18_2_ = auVar38._0_2_;
        auVar38._20_2_ = auVar38._0_2_;
        auVar38._22_2_ = auVar38._0_2_;
        auVar38._24_2_ = auVar38._0_2_;
        auVar38._26_2_ = auVar38._0_2_;
        auVar38._28_2_ = auVar38._0_2_;
        auVar38._30_2_ = auVar38._0_2_;
        auVar32 = vpblendw_avx2(auVar32,auVar38,0x40);
        auVar39._0_2_ = auVar52._28_2_;
        auVar39._2_2_ = auVar39._0_2_;
        auVar39._4_2_ = auVar39._0_2_;
        auVar39._6_2_ = auVar39._0_2_;
        auVar39._8_2_ = auVar39._0_2_;
        auVar39._10_2_ = auVar39._0_2_;
        auVar39._12_2_ = auVar39._0_2_;
        auVar39._14_2_ = auVar39._0_2_;
        auVar39._16_2_ = auVar39._0_2_;
        auVar39._18_2_ = auVar39._0_2_;
        auVar39._20_2_ = auVar39._0_2_;
        auVar39._22_2_ = auVar39._0_2_;
        auVar39._24_2_ = auVar39._0_2_;
        auVar39._26_2_ = auVar39._0_2_;
        auVar39._28_2_ = auVar39._0_2_;
        auVar39._30_2_ = auVar39._0_2_;
        auVar52 = vpblendw_avx2(auVar32,auVar39,0x80);
        local_158 = vpblendd_avx2(auVar47,auVar52,0xf0);
        piVar3 = matrix->mapper;
        uVar22 = (ulong)(uint)s2Len;
        uVar16 = 0;
        do {
          *(short *)(ptr[1] + uVar16 * 2 + 0xe) = (short)piVar3[(byte)_s2[uVar16]];
          uVar16 = uVar16 + 1;
        } while (uVar22 != uVar16);
        *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar31 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar29) {
          uVar31 = uVar29;
        }
        uVar16 = 0;
        auVar52 = ZEXT432(uVar24);
        memset(ptr[1] + uVar22 * 2 + 0xe,0,(ulong)(~s2Len + uVar31) * 2 + 2);
        iVar10 = iVar23;
        do {
          ptr_00[uVar16 + 0xf] = (int16_t)iVar10;
          iVar10 = iVar10 - gap;
          ptr_01[uVar16 + 0xf] = local_1e8._2_2_;
          uVar16 = uVar16 + 1;
        } while (uVar22 != uVar16);
        lVar12 = 0;
        do {
          ptr_00[lVar12] = local_1e8._2_2_;
          ptr_01[lVar12] = local_1e8._2_2_;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0xf);
        lVar12 = uVar22 + 0xf;
        do {
          ptr_00[lVar12] = local_1e8._2_2_;
          ptr_01[lVar12] = local_1e8._2_2_;
          lVar12 = lVar12 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar29);
        ptr_00[0xe] = 0;
        if ((int)uVar20 < 1) {
          auVar44 = ZEXT3264(local_1e8);
          auVar52._2_2_ = sVar18;
          auVar52._0_2_ = sVar18;
          auVar52._4_2_ = sVar18;
          auVar52._6_2_ = sVar18;
          auVar52._8_2_ = sVar18;
          auVar52._10_2_ = sVar18;
          auVar52._12_2_ = sVar18;
          auVar52._14_2_ = sVar18;
          auVar52._16_2_ = sVar18;
          auVar52._18_2_ = sVar18;
          auVar52._20_2_ = sVar18;
          auVar52._22_2_ = sVar18;
          auVar52._24_2_ = sVar18;
          auVar52._26_2_ = sVar18;
          auVar52._28_2_ = sVar18;
          auVar52._30_2_ = sVar18;
          auVar32 = local_1e8;
        }
        else {
          auVar44 = ZEXT3264(local_1e8);
          auVar47 = vpalignr_avx2(ZEXT1632(local_1e8._16_16_),local_1e8,2);
          uVar16 = 1;
          if (1 < (int)uVar29) {
            uVar16 = (ulong)uVar29;
          }
          local_200 = uVar22 * 0x3c + -0x3c;
          lVar12 = uVar22 * 0x40;
          local_218 = uVar22 * 0x38 + -0x38;
          local_220 = uVar22 * 0x34 + -0x34;
          local_228 = uVar22 * 0x18 + -0x18;
          local_230 = uVar22 * 0xc + -0xc;
          local_238 = uVar22 * 0x30 + -0x30;
          local_240 = uVar22 * 0x2c + -0x2c;
          local_248 = uVar22 * 0x28 + -0x28;
          local_250 = uVar22 * 0x24 + -0x24;
          local_258 = uVar22 * 0x20 + -0x20;
          local_260 = uVar22 * 0x1c + -0x1c;
          local_268 = uVar22 * 0x14 + -0x14;
          local_270 = uVar22 * 0x10 + -0x10;
          auVar33 = vpmovsxbw_avx2(_DAT_0090922c);
          auVar34 = vpcmpeqd_avx2(auVar52,auVar52);
          auVar53._8_2_ = 1;
          auVar53._0_8_ = 0x1000100010001;
          auVar53._10_2_ = 1;
          auVar53._12_2_ = 1;
          auVar53._14_2_ = 1;
          auVar53._16_2_ = 1;
          auVar53._18_2_ = 1;
          auVar53._20_2_ = 1;
          auVar53._22_2_ = 1;
          auVar53._24_2_ = 1;
          auVar53._26_2_ = 1;
          auVar53._28_2_ = 1;
          auVar53._30_2_ = 1;
          auVar40 = ZEXT3264(CONCAT230(sVar18,CONCAT228(sVar18,CONCAT226(sVar18,CONCAT224(sVar18,
                                                  CONCAT222(sVar18,CONCAT220(sVar18,CONCAT218(sVar18
                                                  ,CONCAT216(sVar18,CONCAT214(sVar18,CONCAT212(
                                                  sVar18,CONCAT210(sVar18,CONCAT28(sVar18,CONCAT26(
                                                  sVar18,CONCAT24(sVar18,CONCAT22(sVar18,sVar18)))))
                                                  )))))))))));
          auVar42 = ZEXT3264(local_1e8);
          piVar3 = matrix->matrix;
          local_208 = uVar22 * 4 + -4;
          local_278 = uVar22 * 8 + -8;
          local_210 = 0;
          uVar27 = 0;
          do {
            uVar20 = (uint)uVar27;
            if (matrix->type == 0) {
              local_2e0 = (uint)local_2c0[uVar27 + 1];
              local_310 = (uint)local_2c0[uVar27 + 2];
              uVar24 = (uint)local_2c0[uVar27 + 3];
              local_2c8 = (uint)local_2c0[uVar27 + 4];
              uVar31 = (uint)local_2c0[uVar27 + 5];
              local_2e8 = (uint)local_2c0[uVar27 + 6];
              local_2d8 = (uint)local_2c0[uVar27 + 7];
              uVar28 = (uint)local_2c0[uVar27 + 8];
              uVar19 = (uint)local_2c0[uVar27 + 9];
              local_2f0 = (uint)local_2c0[uVar27 + 10];
              uVar17 = (uint)local_2c0[uVar27 + 0xb];
              local_2f8 = (uint)local_2c0[uVar27 + 0xc];
              uVar26 = (uint)local_2c0[uVar27 + 0xd];
              local_300 = (uint)local_2c0[uVar27 + 0xe];
              local_2d0 = (uint)local_2c0[uVar27 + 0xf];
              uVar29 = (int)local_2c0[uVar27];
            }
            else {
              local_2e0 = uVar20 | 1;
              if (uVar21 <= (uVar27 | 1)) {
                local_2e0 = local_308;
              }
              local_310 = uVar20 | 2;
              if (uVar21 <= (uVar27 | 2)) {
                local_310 = local_308;
              }
              uVar24 = uVar20 | 3;
              if (uVar21 <= (uVar27 | 3)) {
                uVar24 = local_308;
              }
              local_2c8 = uVar20 | 4;
              if (uVar21 <= (uVar27 | 4)) {
                local_2c8 = local_308;
              }
              uVar31 = uVar20 | 5;
              if (uVar21 <= (uVar27 | 5)) {
                uVar31 = local_308;
              }
              local_2e8 = uVar20 | 6;
              if (uVar21 <= (uVar27 | 6)) {
                local_2e8 = local_308;
              }
              local_2d8 = uVar20 | 7;
              if (uVar21 <= (uVar27 | 7)) {
                local_2d8 = local_308;
              }
              uVar28 = uVar20 | 8;
              if (uVar21 <= (uVar27 | 8)) {
                uVar28 = local_308;
              }
              uVar19 = uVar20 | 9;
              if (uVar21 <= (uVar27 | 9)) {
                uVar19 = local_308;
              }
              local_2f0 = uVar20 | 10;
              if (uVar21 <= (uVar27 | 10)) {
                local_2f0 = local_308;
              }
              uVar17 = uVar20 | 0xb;
              if (uVar21 <= (uVar27 | 0xb)) {
                uVar17 = local_308;
              }
              local_2f8 = uVar20 | 0xc;
              if (uVar21 <= (uVar27 | 0xc)) {
                local_2f8 = local_308;
              }
              uVar26 = uVar20 | 0xd;
              if (uVar21 <= (uVar27 | 0xd)) {
                uVar26 = local_308;
              }
              local_300 = uVar20 | 0xe;
              if (uVar21 <= (uVar27 | 0xe)) {
                local_300 = local_308;
              }
              local_2d0 = uVar20 | 0xf;
              uVar29 = uVar20;
              if (uVar21 <= (uVar27 | 0xf)) {
                local_2d0 = local_308;
              }
            }
            iVar10 = matrix->size;
            iVar2 = ptr_00[0xe];
            auVar49._2_2_ = iVar2;
            auVar49._0_2_ = iVar2;
            auVar49._4_2_ = iVar2;
            auVar49._6_2_ = iVar2;
            auVar49._8_2_ = iVar2;
            auVar49._10_2_ = iVar2;
            auVar49._12_2_ = iVar2;
            auVar49._14_2_ = iVar2;
            auVar49._16_2_ = iVar2;
            auVar49._18_2_ = iVar2;
            auVar49._20_2_ = iVar2;
            auVar49._22_2_ = iVar2;
            auVar49._24_2_ = iVar2;
            auVar49._26_2_ = iVar2;
            auVar49._28_2_ = iVar2;
            auVar49._30_2_ = iVar2;
            uVar1 = uVar27 + 0x10;
            ptr_00[0xe] = auVar39._0_2_ - (short)uVar1 * sVar14;
            auVar57._0_2_ = (undefined2)(iVar23 - uVar20 * gap);
            auVar57._2_2_ = auVar57._0_2_;
            auVar57._4_2_ = auVar57._0_2_;
            auVar57._6_2_ = auVar57._0_2_;
            auVar57._8_2_ = auVar57._0_2_;
            auVar57._10_2_ = auVar57._0_2_;
            auVar57._12_2_ = auVar57._0_2_;
            auVar57._14_2_ = auVar57._0_2_;
            auVar57._16_2_ = auVar57._0_2_;
            auVar57._18_2_ = auVar57._0_2_;
            auVar57._20_2_ = auVar57._0_2_;
            auVar57._22_2_ = auVar57._0_2_;
            auVar57._24_2_ = auVar57._0_2_;
            auVar57._26_2_ = auVar57._0_2_;
            auVar57._28_2_ = auVar57._0_2_;
            auVar57._30_2_ = auVar57._0_2_;
            auVar52 = vpblendw_avx2(auVar47,auVar57,0x80);
            auVar36 = vpblendd_avx2(auVar47,auVar52,0xf0);
            auVar52 = vpblendw_avx2(auVar47,auVar49,0x80);
            auVar49 = vpblendd_avx2(auVar47,auVar52,0xf0);
            auVar48 = vpcmpeqw_avx2(auVar33,auVar51);
            auVar35 = vpmovsxbw_avx2(_DAT_0090923c);
            uVar13 = 0;
            auVar37 = local_1e8;
            auVar38 = local_1e8;
            do {
              auVar56 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(local_2d8 * iVar10) +
                                                         (long)*(short *)(ptr[1] + uVar13 * 2)]),
                                    (uint)*(ushort *)
                                           (piVar3 + (long)(int)(local_2e8 * iVar10) +
                                                     (long)*(short *)(ptr[1] + uVar13 * 2 + 2)),1);
              auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar31 * iVar10) +
                                                             (long)*(short *)(ptr[1] + uVar13 * 2 +
                                                                                       4)),2);
              auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_2c8 * iVar10) +
                                                             (long)*(short *)(ptr[1] + uVar13 * 2 +
                                                                                       6)),3);
              auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar24 * iVar10) +
                                                             (long)*(short *)(ptr[1] + uVar13 * 2 +
                                                                                       8)),4);
              auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_310 * iVar10) +
                                                             (long)*(short *)(ptr[1] + uVar13 * 2 +
                                                                                       10)),5);
              auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_2e0 * iVar10) +
                                                             (long)*(short *)(ptr[1] + uVar13 * 2 +
                                                                                       0xc)),6);
              auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar29 * iVar10) +
                                                             (long)*(short *)(ptr[1] + uVar13 * 2 +
                                                                                       0xe)),7);
              auVar58 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(local_2d0 * iVar10) +
                                                         (long)*(short *)(*ptr + uVar13 * 2)]),
                                    (uint)*(ushort *)
                                           (piVar3 + (long)(int)(local_300 * iVar10) +
                                                     (long)*(short *)(*ptr + uVar13 * 2 + 2)),1);
              auVar58 = vpinsrw_avx(auVar58,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar26 * iVar10) +
                                                             (long)*(short *)(*ptr + uVar13 * 2 + 4)
                                                   ),2);
              auVar58 = vpinsrw_avx(auVar58,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_2f8 * iVar10) +
                                                             (long)*(short *)(*ptr + uVar13 * 2 + 6)
                                                   ),3);
              auVar58 = vpinsrw_avx(auVar58,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar17 * iVar10) +
                                                             (long)*(short *)(*ptr + uVar13 * 2 + 8)
                                                   ),4);
              auVar58 = vpinsrw_avx(auVar58,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_2f0 * iVar10) +
                                                             (long)*(short *)(*ptr + uVar13 * 2 + 10
                                                                             )),5);
              auVar58 = vpinsrw_avx(auVar58,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar19 * iVar10) +
                                                             (long)*(short *)(*ptr + uVar13 * 2 +
                                                                                     0xc)),6);
              auVar58 = vpinsrw_avx(auVar58,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar28 * iVar10) +
                                                             (long)*(short *)(*ptr + uVar13 * 2 +
                                                                                     0xe)),7);
              iVar2 = ptr_00[uVar13 + 0xf];
              auVar54._2_2_ = iVar2;
              auVar54._0_2_ = iVar2;
              auVar54._4_2_ = iVar2;
              auVar54._6_2_ = iVar2;
              auVar54._8_2_ = iVar2;
              auVar54._10_2_ = iVar2;
              auVar54._12_2_ = iVar2;
              auVar54._14_2_ = iVar2;
              auVar54._16_2_ = iVar2;
              auVar54._18_2_ = iVar2;
              auVar54._20_2_ = iVar2;
              auVar54._22_2_ = iVar2;
              auVar54._24_2_ = iVar2;
              auVar54._26_2_ = iVar2;
              auVar54._28_2_ = iVar2;
              auVar54._30_2_ = iVar2;
              auVar59._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar58;
              auVar59._16_16_ = ZEXT116(1) * auVar56;
              auVar32 = vpalignr_avx2(ZEXT1632(auVar36._16_16_),auVar36,2);
              auVar57 = vpblendw_avx2(auVar32,auVar54,0x80);
              auVar52 = vpaddsw_avx2(auVar49,auVar59);
              auVar49 = vpblendd_avx2(auVar32,auVar57,0xf0);
              iVar2 = ptr_01[uVar13 + 0xf];
              auVar55._2_2_ = iVar2;
              auVar55._0_2_ = iVar2;
              auVar55._4_2_ = iVar2;
              auVar55._6_2_ = iVar2;
              auVar55._8_2_ = iVar2;
              auVar55._10_2_ = iVar2;
              auVar55._12_2_ = iVar2;
              auVar55._14_2_ = iVar2;
              auVar55._16_2_ = iVar2;
              auVar55._18_2_ = iVar2;
              auVar55._20_2_ = iVar2;
              auVar55._22_2_ = iVar2;
              auVar55._24_2_ = iVar2;
              auVar55._26_2_ = iVar2;
              auVar55._28_2_ = iVar2;
              auVar55._30_2_ = iVar2;
              auVar32 = vpalignr_avx2(ZEXT1632(auVar37._16_16_),auVar37,2);
              auVar37 = vpblendw_avx2(auVar32,auVar55,0x80);
              auVar37 = vpblendd_avx2(auVar32,auVar37,0xf0);
              auVar9._2_2_ = sVar5;
              auVar9._0_2_ = sVar5;
              auVar9._4_2_ = sVar5;
              auVar9._6_2_ = sVar5;
              auVar9._8_2_ = sVar5;
              auVar9._10_2_ = sVar5;
              auVar9._12_2_ = sVar5;
              auVar9._14_2_ = sVar5;
              auVar9._16_2_ = sVar5;
              auVar9._18_2_ = sVar5;
              auVar9._20_2_ = sVar5;
              auVar9._22_2_ = sVar5;
              auVar9._24_2_ = sVar5;
              auVar9._26_2_ = sVar5;
              auVar9._28_2_ = sVar5;
              auVar9._30_2_ = sVar5;
              auVar32 = vpsubsw_avx2(auVar49,auVar9);
              auVar8._2_2_ = sVar14;
              auVar8._0_2_ = sVar14;
              auVar8._4_2_ = sVar14;
              auVar8._6_2_ = sVar14;
              auVar8._8_2_ = sVar14;
              auVar8._10_2_ = sVar14;
              auVar8._12_2_ = sVar14;
              auVar8._14_2_ = sVar14;
              auVar8._16_2_ = sVar14;
              auVar8._18_2_ = sVar14;
              auVar8._20_2_ = sVar14;
              auVar8._22_2_ = sVar14;
              auVar8._24_2_ = sVar14;
              auVar8._26_2_ = sVar14;
              auVar8._28_2_ = sVar14;
              auVar8._30_2_ = sVar14;
              auVar37 = vpsubsw_avx2(auVar37,auVar8);
              auVar37 = vpmaxsw_avx2(auVar32,auVar37);
              auVar32 = vpsubsw_avx2(auVar36,auVar9);
              auVar36 = vpsubsw_avx2(auVar38,auVar8);
              auVar57 = vpmaxsw_avx2(auVar32,auVar36);
              auVar32 = vpmaxsw_avx2(auVar57,auVar37);
              auVar52 = vpmaxsw_avx2(auVar52,auVar32);
              auVar38 = vpcmpeqw_avx2(auVar35,auVar34);
              auVar36 = vpblendvb_avx2(auVar52,local_158,auVar38);
              if (0xf < uVar13) {
                auVar52 = vpminsw_avx2(auVar36,auVar40._0_32_);
                auVar40 = ZEXT3264(auVar52);
                auVar52 = vpmaxsw_avx2(auVar36,auVar42._0_32_);
                auVar42 = ZEXT3264(auVar52);
              }
              auVar32 = auVar42._0_32_;
              auVar52 = auVar40._0_32_;
              piVar4 = ((ppVar11->field_4).rowcols)->score_row;
              auVar56 = auVar36._0_16_;
              auVar58 = auVar36._16_16_;
              if (uVar13 < uVar22) {
                uVar30 = vpextrw_avx(auVar58,7);
                *(int *)((long)piVar4 + uVar13 * 4 + local_210) = (int)(short)uVar30;
              }
              if (uVar13 - 1 < uVar22 && (uVar27 | 1) < uVar21) {
                uVar30 = vpextrw_avx(auVar58,6);
                *(int *)((long)piVar4 + uVar13 * 4 + local_208) = (int)(short)uVar30;
              }
              if (((uVar27 | 2) < uVar21) && ((long)(uVar13 - 2) < (long)uVar22 && 1 < uVar13)) {
                uVar30 = vpextrw_avx(auVar58,5);
                *(int *)((long)piVar4 + uVar13 * 4 + local_278) = (int)(short)uVar30;
              }
              if (((uVar27 | 3) < uVar21) && ((long)(uVar13 - 3) < (long)uVar22 && 2 < uVar13)) {
                uVar30 = vpextrw_avx(auVar58,4);
                *(int *)((long)piVar4 + uVar13 * 4 + local_230) = (int)(short)uVar30;
              }
              if (((uVar27 | 4) < uVar21) && ((long)(uVar13 - 4) < (long)uVar22 && 3 < uVar13)) {
                uVar30 = vpextrw_avx(auVar58,3);
                *(int *)((long)piVar4 + uVar13 * 4 + local_270) = (int)(short)uVar30;
              }
              if (((uVar27 | 5) < uVar21) && ((long)(uVar13 - 5) < (long)uVar22 && 4 < uVar13)) {
                uVar30 = vpextrw_avx(auVar58,2);
                *(int *)((long)piVar4 + uVar13 * 4 + local_268) = (int)(short)uVar30;
              }
              if (((uVar27 | 6) < uVar21) && ((long)(uVar13 - 6) < (long)uVar22 && 5 < uVar13)) {
                uVar30 = vpextrw_avx(auVar58,1);
                *(int *)((long)piVar4 + uVar13 * 4 + local_228) = (int)(short)uVar30;
              }
              if (((uVar27 | 7) < uVar21) && ((long)(uVar13 - 7) < (long)uVar22 && 6 < uVar13)) {
                *(int *)((long)piVar4 + uVar13 * 4 + local_260) = (int)auVar36._16_2_;
              }
              if (((uVar27 | 8) < uVar21) && ((long)(uVar13 - 8) < (long)uVar22 && 7 < uVar13)) {
                uVar30 = vpextrw_avx(auVar56,7);
                *(int *)((long)piVar4 + uVar13 * 4 + local_258) = (int)(short)uVar30;
              }
              if (((uVar27 | 9) < uVar21) && ((long)(uVar13 - 9) < (long)uVar22 && 8 < uVar13)) {
                uVar30 = vpextrw_avx(auVar56,6);
                *(int *)((long)piVar4 + uVar13 * 4 + local_250) = (int)(short)uVar30;
              }
              if (((uVar27 | 10) < uVar21) && ((long)(uVar13 - 10) < (long)uVar22 && 9 < uVar13)) {
                uVar30 = vpextrw_avx(auVar56,5);
                *(int *)((long)piVar4 + uVar13 * 4 + local_248) = (int)(short)uVar30;
              }
              if (((uVar27 | 0xb) < uVar21) && ((long)(uVar13 - 0xb) < (long)uVar22 && 10 < uVar13))
              {
                uVar30 = vpextrw_avx(auVar56,4);
                *(int *)((long)piVar4 + uVar13 * 4 + local_240) = (int)(short)uVar30;
              }
              if (((uVar27 | 0xc) < uVar21) && ((long)(uVar13 - 0xc) < (long)uVar22 && 0xb < uVar13)
                 ) {
                uVar30 = vpextrw_avx(auVar56,3);
                *(int *)((long)piVar4 + uVar13 * 4 + local_238) = (int)(short)uVar30;
              }
              if (((uVar27 | 0xd) < uVar21) && ((long)(uVar13 - 0xd) < (long)uVar22 && 0xc < uVar13)
                 ) {
                uVar30 = vpextrw_avx(auVar56,2);
                *(int *)((long)piVar4 + uVar13 * 4 + local_220) = (int)(short)uVar30;
              }
              if (((uVar27 | 0xe) < uVar21) && ((long)(uVar13 - 0xe) < (long)uVar22 && 0xd < uVar13)
                 ) {
                uVar30 = vpextrw_avx(auVar56,1);
                *(int *)((long)piVar4 + uVar13 * 4 + local_218) = (int)(short)uVar30;
              }
              if (0xe < uVar13 && (uVar27 | 0xf) < uVar21) {
                *(int *)((long)piVar4 + uVar13 * 4 + local_200) = (int)auVar36._0_2_;
              }
              auVar37 = vpblendvb_avx2(auVar37,local_1e8,auVar38);
              auVar38 = vpblendvb_avx2(auVar57,local_1e8,auVar38);
              ptr_00[uVar13] = auVar36._0_2_;
              vpextrw_avx(auVar37._0_16_,0);
              auVar57 = vpcmpeqw_avx2(auVar35,auVar43);
              auVar57 = vpand_avx2(auVar48,auVar57);
              auVar57 = vpblendvb_avx2(auVar44._0_32_,auVar36,auVar57);
              auVar44 = ZEXT3264(auVar57);
              auVar35 = vpaddsw_avx2(auVar35,auVar53);
              uVar13 = uVar13 + 1;
            } while (uVar16 != uVar13);
            auVar6._8_2_ = 0x10;
            auVar6._0_8_ = 0x10001000100010;
            auVar6._10_2_ = 0x10;
            auVar6._12_2_ = 0x10;
            auVar6._14_2_ = 0x10;
            auVar6._16_2_ = 0x10;
            auVar6._18_2_ = 0x10;
            auVar6._20_2_ = 0x10;
            auVar6._22_2_ = 0x10;
            auVar6._24_2_ = 0x10;
            auVar6._26_2_ = 0x10;
            auVar6._28_2_ = 0x10;
            auVar6._30_2_ = 0x10;
            auVar33 = vpaddsw_avx2(auVar33,auVar6);
            auVar7._2_2_ = uVar41;
            auVar7._0_2_ = uVar41;
            auVar7._4_2_ = uVar41;
            auVar7._6_2_ = uVar41;
            auVar7._8_2_ = uVar41;
            auVar7._10_2_ = uVar41;
            auVar7._12_2_ = uVar41;
            auVar7._14_2_ = uVar41;
            auVar7._16_2_ = uVar41;
            auVar7._18_2_ = uVar41;
            auVar7._20_2_ = uVar41;
            auVar7._22_2_ = uVar41;
            auVar7._24_2_ = uVar41;
            auVar7._26_2_ = uVar41;
            auVar7._28_2_ = uVar41;
            auVar7._30_2_ = uVar41;
            local_158 = vpsubsw_avx2(local_158,auVar7);
            local_200 = local_200 + lVar12;
            local_210 = local_210 + lVar12;
            local_208 = local_208 + lVar12;
            local_218 = local_218 + lVar12;
            local_220 = local_220 + lVar12;
            local_238 = local_238 + lVar12;
            local_240 = local_240 + lVar12;
            local_248 = local_248 + lVar12;
            local_250 = local_250 + lVar12;
            local_258 = local_258 + lVar12;
            local_260 = local_260 + lVar12;
            local_228 = local_228 + lVar12;
            local_268 = local_268 + lVar12;
            local_270 = local_270 + lVar12;
            local_230 = local_230 + lVar12;
            local_278 = local_278 + lVar12;
            uVar27 = uVar1;
          } while (uVar1 < uVar21);
        }
        iVar23 = 0x10;
        do {
          iVar10 = vpextrw_avx(auVar44._16_16_,7);
          if ((short)iVar10 <= (short)iVar25) {
            iVar10 = iVar25;
          }
          iVar25 = iVar10;
          sVar14 = (short)iVar25;
          auVar43 = auVar44._0_32_;
          auVar51 = vperm2i128_avx2(auVar43,auVar43,0x28);
          auVar51 = vpalignr_avx2(auVar43,auVar51,0xe);
          auVar44 = ZEXT3264(auVar51);
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        auVar52 = vpcmpgtw_avx2(local_1e8,auVar52);
        auVar51._2_2_ = sVar18;
        auVar51._0_2_ = sVar18;
        auVar51._4_2_ = sVar18;
        auVar51._6_2_ = sVar18;
        auVar51._8_2_ = sVar18;
        auVar51._10_2_ = sVar18;
        auVar51._12_2_ = sVar18;
        auVar51._14_2_ = sVar18;
        auVar51._16_2_ = sVar18;
        auVar51._18_2_ = sVar18;
        auVar51._20_2_ = sVar18;
        auVar51._22_2_ = sVar18;
        auVar51._24_2_ = sVar18;
        auVar51._26_2_ = sVar18;
        auVar51._28_2_ = sVar18;
        auVar51._30_2_ = sVar18;
        auVar51 = vpcmpgtw_avx2(auVar32,auVar51);
        auVar52 = vpor_avx2(auVar52,auVar51);
        if ((((((((((((((((((((((((((((((((auVar52 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar52 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar52 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar52 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar52 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar52 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar52 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar52 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar52 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar52 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar52 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar52 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar52 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar52 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar52 >> 0x7f,0) != '\0') ||
                          (auVar52 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar52 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar52 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar52 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar52 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar52 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar52 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar52 >> 0xbf,0) != '\0') ||
                  (auVar52 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar52 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar52 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar52 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar52 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar52 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar52 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar52[0x1f] < '\0') {
          *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
          sVar14 = 0;
          iVar15 = 0;
          local_308 = 0;
        }
        ppVar11->score = (int)sVar14;
        ppVar11->end_query = local_308;
        ppVar11->end_ref = iVar15;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_2c0);
          return ppVar11;
        }
        return ppVar11;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, -open - i*gap, 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi16(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm256_extract_epi16_rpl(vMax, 15);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 2);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}